

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall Fad<long_double>::Fad(Fad<long_double> *this,int sz,int i,longdouble *x)

{
  longdouble *plVar1;
  unkbyte10 *in_RCX;
  int in_EDX;
  undefined4 in_ESI;
  FadSuper *in_RDI;
  Vector<long_double> *unaff_retaddr;
  FadSuper *pFVar2;
  
  pFVar2 = in_RDI;
  FadSuper::FadSuper(in_RDI);
  *(unkbyte10 *)in_RDI = *in_RCX;
  Vector<long_double>::Vector
            (unaff_retaddr,(int)((ulong)pFVar2 >> 0x20),(longdouble *)CONCAT44(in_ESI,in_EDX));
  *(longdouble *)(in_RDI + 0x20) = (longdouble)0;
  plVar1 = Vector<long_double>::operator[]((Vector<long_double> *)(in_RDI + 0x10),in_EDX);
  *plVar1 = (longdouble)1;
  return;
}

Assistant:

Fad(const int sz, const int i, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0))
    {dx_[i]=1.;}